

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t add_owner_id(archive_match *a,id_array *ids,int64_t id)

{
  ulong uVar1;
  uint uVar2;
  int64_t *piVar3;
  ulong uVar5;
  size_t sVar6;
  ulong uVar4;
  
  uVar1 = ids->size;
  if (uVar1 <= ids->count + 1) {
    sVar6 = 8;
    if (uVar1 != 0) {
      sVar6 = uVar1 * 2;
    }
    ids->size = sVar6;
    piVar3 = (int64_t *)realloc(ids->ids,sVar6 << 3);
    if (piVar3 == (int64_t *)0x0) {
      archive_set_error(&a->archive,0xc,"No memory");
      (a->archive).state = 0x8000;
      return L'\xffffffe2';
    }
    ids->ids = piVar3;
  }
  uVar1 = ids->count;
  if (uVar1 == 0) {
    uVar5 = 1;
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      uVar2 = (uint)uVar4;
      if (id <= ids->ids[uVar4]) break;
      uVar2 = uVar2 + 1;
      uVar4 = (ulong)uVar2;
    } while (uVar4 < uVar1);
    uVar5 = (ulong)(uVar2 + 1);
  }
  piVar3 = ids->ids;
  if (uVar1 - uVar4 == 0) {
    ids->count = uVar1 + 1;
    piVar3[uVar1] = id;
  }
  else if (piVar3[uVar4] != id) {
    memmove(piVar3 + uVar5,piVar3 + uVar4,(uVar1 - uVar4) * 8);
    ids->ids[uVar4] = id;
    ids->count = ids->count + 1;
  }
  *(byte *)&a->setflag = (byte)a->setflag | 4;
  return L'\0';
}

Assistant:

static int
add_owner_id(struct archive_match *a, struct id_array *ids, int64_t id)
{
	unsigned i;

	if (ids->count + 1 >= ids->size) {
		void *p;

		if (ids->size == 0)
			ids->size = 8;
		else
			ids->size *= 2;
		p = realloc(ids->ids, sizeof(*ids->ids) * ids->size);
		if (p == NULL)
			return (error_nomem(a));
		ids->ids = (int64_t *)p;
	}

	/* Find an insert point. */
	for (i = 0; i < ids->count; i++) {
		if (ids->ids[i] >= id)
			break;
	}

	/* Add owner id. */
	if (i == ids->count)
		ids->ids[ids->count++] = id;
	else if (ids->ids[i] != id) {
		memmove(&(ids->ids[i+1]), &(ids->ids[i]),
		    (ids->count - i) * sizeof(ids->ids[0]));
		ids->ids[i] = id;
		ids->count++;
	}
	a->setflag |= ID_IS_SET;
	return (ARCHIVE_OK);
}